

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_palette.cpp
# Opt level: O2

void Cmd_testcolor(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  PalEntry lightcolor;
  int iVar2;
  FString *pFVar3;
  FString cstr;
  char *__nptr;
  FString colorstring;
  FString local_18;
  
  colorstring.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  iVar1 = FCommandLine::argc(argv);
  if (iVar1 < 2) {
    Printf("testcolor <color> [desaturation]\n");
  }
  else {
    FCommandLine::operator[](argv,1);
    V_GetColorStringByName((char *)&local_18);
    pFVar3 = FString::operator=(&colorstring,&local_18);
    iVar1 = *(int *)(pFVar3->Chars + -0xc);
    FString::~FString(&local_18);
    cstr = colorstring;
    if (iVar1 == 0) {
      cstr.Chars = FCommandLine::operator[](argv,1);
    }
    lightcolor.field_0 =
         (anon_union_4_2_12391d7c_for_PalEntry_0)V_GetColorFromString((DWORD *)0x0,cstr.Chars);
    iVar2 = FCommandLine::argc(argv);
    iVar1 = NormalLight.Desaturate;
    if (2 < iVar2) {
      __nptr = FCommandLine::operator[](argv,2);
      iVar1 = atoi(__nptr);
    }
    FDynamicColormap::ChangeColor(&NormalLight,lightcolor,iVar1);
  }
  FString::~FString(&colorstring);
  return;
}

Assistant:

CCMD (testcolor)
{
	FString colorstring;
	DWORD color;
	int desaturate;

	if (argv.argc() < 2)
	{
		Printf ("testcolor <color> [desaturation]\n");
	}
	else
	{
		if ( !(colorstring = V_GetColorStringByName (argv[1])).IsEmpty() )
		{
			color = V_GetColorFromString (NULL, colorstring);
		}
		else
		{
			color = V_GetColorFromString (NULL, argv[1]);
		}
		if (argv.argc() > 2)
		{
			desaturate = atoi (argv[2]);
		}
		else
		{
			desaturate = NormalLight.Desaturate;
		}
		NormalLight.ChangeColor (color, desaturate);
	}
}